

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

Node * node_new_call(OnigUChar *name,OnigUChar *name_end,int gnum,int by_number)

{
  Node *node;
  int by_number_local;
  int gnum_local;
  OnigUChar *name_end_local;
  OnigUChar *name_local;
  
  name_local = (OnigUChar *)node_new();
  if ((Node *)name_local == (Node *)0x0) {
    name_local = (OnigUChar *)0x0;
  }
  else {
    (((Node *)name_local)->u).base.node_type = ND_CALL;
    (((Node *)name_local)->u).quant.lower = by_number;
    (((Node *)name_local)->u).call.name = name;
    (((Node *)name_local)->u).call.name_end = name_end;
    (((Node *)name_local)->u).quant.upper = gnum;
    (((Node *)name_local)->u).cclass.bs[7] = 1;
  }
  return (Node *)name_local;
}

Assistant:

static Node*
node_new_call(UChar* name, UChar* name_end, int gnum, int by_number)
{
  Node* node = node_new();
  CHECK_NULL_RETURN(node);

  ND_SET_TYPE(node, ND_CALL);
  CALL_(node)->by_number   = by_number;
  CALL_(node)->name        = name;
  CALL_(node)->name_end    = name_end;
  CALL_(node)->called_gnum = gnum;
  CALL_(node)->entry_count = 1;
  return node;
}